

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O2

void sys_bashfilename(char *from,char *to)

{
  long lVar1;
  
  for (lVar1 = 0; from[lVar1] != '\0'; lVar1 = lVar1 + 1) {
    to[lVar1] = from[lVar1];
  }
  to[lVar1] = '\0';
  return;
}

Assistant:

void sys_bashfilename(const char *from, char *to)
{
    char c;
    while ((c = *from++))
    {
#ifdef _WIN32
        if (c == '/') c = '\\';
#endif
        *to++ = c;
    }
    *to = 0;
}